

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ngram_model_trie.c
# Opt level: O3

void read_word_str(ngram_model_t *base,FILE *fp,int do_swap)

{
  uint uVar1;
  undefined8 in_RAX;
  void *__ptr;
  char *pcVar2;
  void *pvVar3;
  size_t sVar4;
  ulong uVar5;
  uint uVar6;
  void *val;
  uint local_34;
  
  local_34 = (uint)((ulong)in_RAX >> 0x20);
  base->writable = '\x01';
  fread(&local_34,4,1,(FILE *)fp);
  uVar1 = local_34 >> 0x18 | (local_34 & 0xff0000) >> 8 | (local_34 & 0xff00) << 8 |
          local_34 << 0x18;
  if (do_swap == 0) {
    uVar1 = local_34;
  }
  uVar6 = 0;
  err_msg(ERR_INFO,
          "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
          ,0x140,"#word_str: %d\n",(ulong)uVar1);
  __ptr = __ckd_calloc__((long)(int)uVar1,1,
                         "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                         ,0x141);
  fread(__ptr,1,(long)(int)uVar1,(FILE *)fp);
  if (uVar1 != 0) {
    uVar5 = 0;
    uVar6 = 0;
    do {
      uVar6 = uVar6 + (*(char *)((long)__ptr + uVar5) == '\0');
      uVar5 = uVar5 + 1;
    } while (uVar1 != uVar5);
  }
  if (uVar6 != *base->n_counts) {
    err_msg(ERR_ERROR,
            "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
            ,0x14b,"Error reading word strings (%d doesn\'t match n_unigrams %d)\n",(ulong)uVar6);
    uVar6 = *base->n_counts;
  }
  if (uVar6 != 0) {
    val = (void *)0x0;
    uVar5 = 0;
    do {
      pcVar2 = __ckd_salloc__((char *)((long)__ptr + (uVar5 & 0xffffffff)),
                              "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                              ,0x151);
      base->word_str[(long)val] = pcVar2;
      pvVar3 = hash_table_enter(base->wid,base->word_str[(long)val],val);
      if (pvVar3 != val) {
        err_msg(ERR_WARN,
                "/workspace/llm4binary/github/license_c_cmakelists/cmusphinx[P]pocketsphinx/src/lm/ngram_model_trie.c"
                ,0x155,"Duplicate word in dictionary: %s\n",base->word_str[(long)val]);
      }
      sVar4 = strlen(base->word_str[(long)val]);
      uVar5 = sVar4 + (uVar5 & 0xffffffff) + 1;
      val = (void *)((long)val + 1);
    } while (val < (void *)(ulong)*base->n_counts);
  }
  free(__ptr);
  return;
}

Assistant:

static void
read_word_str(ngram_model_t * base, FILE * fp, int do_swap)
{
    int32 k;
    uint32 i, j;
    char *tmp_word_str;
    /* read ascii word strings */
    base->writable = TRUE;
    fread(&k, sizeof(k), 1, fp);
    if (do_swap)
        SWAP_INT32(&k);
    E_INFO("#word_str: %d\n", k);
    tmp_word_str = (char *) ckd_calloc((size_t) k, 1);
    fread(tmp_word_str, 1, (size_t) k, fp);

    /* First make sure string just read contains n_counts[0] words (PARANOIA!!) */
    for (i = 0, j = 0; i < (uint32) k; i++)
        if (tmp_word_str[i] == '\0')
            j++;
    if (j != base->n_counts[0]) {
        E_ERROR
            ("Error reading word strings (%d doesn't match n_unigrams %d)\n",
             j, base->n_counts[0]);
    }

    /* Break up string just read into words */
    j = 0;
    for (i = 0; i < base->n_counts[0]; i++) {
        base->word_str[i] = ckd_salloc(tmp_word_str + j);
        if (hash_table_enter(base->wid, base->word_str[i],
                             (void *) (size_t) i) != (void *) (size_t) i) {
            E_WARN("Duplicate word in dictionary: %s\n",
                   base->word_str[i]);
        }
        j += strlen(base->word_str[i]) + 1;
    }
    free(tmp_word_str);
}